

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

bool __thiscall
wasm::DAE::removeReturnValue
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  uintptr_t *puVar1;
  Type left;
  bool bVar2;
  iterator iVar3;
  Expression *right;
  Block *pBVar4;
  Module *pMVar5;
  Builder BVar6;
  Module *pMVar7;
  Signature SVar8;
  optional<wasm::Type> type;
  Builder local_60;
  Builder builder;
  Type local_38;
  Call *call;
  
  pMVar5 = module;
  SVar8 = HeapType::getSignature(&func->type);
  local_38 = SVar8.results.id;
  bVar2 = wasm::Type::isNull(&local_38);
  if (bVar2) {
    SVar8 = HeapType::getSignature(&func->type);
    bVar2 = ((undefined1  [16])SVar8 & (undefined1  [16])0x3) == (undefined1  [16])0x0 &&
            6 < SVar8.results.id.id;
  }
  else {
    bVar2 = false;
  }
  Function::setResults(func,(Type)0x0);
  pMVar7 = (Module *)
           (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
  BVar6.wasm = (Module *)
               (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  builder.wasm = BVar6.wasm;
  while( true ) {
    if (pMVar7 == BVar6.wasm) {
      ReturnUtils::removeReturns(func,module);
      return bVar2;
    }
    local_38.id = (uintptr_t)
                  (pMVar7->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = std::
            _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->allDroppedCalls)._M_h,(key_type *)&local_38);
    left.id = local_38.id;
    if (iVar3.super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>.
        _M_cur == (__node_type *)0x0) break;
    puVar1 = *(uintptr_t **)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                     ._M_cur + 0x10);
    if (bVar2 == false) {
      *puVar1 = local_38.id;
    }
    else {
      local_60.wasm = module;
      right = (Expression *)MixedArena::alloc<wasm::Unreachable>(&module->allocator);
      BVar6 = builder;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pMVar5;
      pBVar4 = Builder::makeSequence(&local_60,(Expression *)left.id,right,type);
      *puVar1 = (uintptr_t)pBVar4;
    }
    if (((Type *)(local_38.id + 8))->id != 1) {
      ((Type *)(local_38.id + 8))->id = 0;
    }
    pMVar7 = (Module *)
             &(pMVar7->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  __assert_fail("iter != allDroppedCalls.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                ,0x1b8,
                "bool wasm::DAE::removeReturnValue(Function *, std::vector<Call *> &, Module *)");
}

Assistant:

bool
  removeReturnValue(Function* func, std::vector<Call*>& calls, Module* module) {
    // If the result type is uninhabitable, then the caller knows the call will
    // never return. That useful information would be lost if we did nothing
    // else when removing the return value, but we will insert an `unreachable`
    // after the call in the caller to preserve the optimization effect. TODO:
    // Do this for more complicated uninhabitable types such as non-nullable
    // references to structs with non-nullable reference cycles.
    bool wasReturnUninhabitable =
      func->getResults().isNull() && func->getResults().isNonNullable();
    func->setResults(Type::none);
    // Remove the drops on the calls. Note that we must do this before updating
    // returns in ReturnUpdater, as there may be recursive calls of this
    // function to itself. So we first use the information in allDroppedCalls
    // before the ReturnUpdater potentially invalidates that information as it
    // modifies the function.
    for (auto* call : calls) {
      auto iter = allDroppedCalls.find(call);
      assert(iter != allDroppedCalls.end());
      Expression** location = iter->second;
      if (wasReturnUninhabitable) {
        Builder builder(*module);
        *location = builder.makeSequence(call, builder.makeUnreachable());
      } else {
        *location = call;
      }
      // Update the call's type.
      if (call->type != Type::unreachable) {
        call->type = Type::none;
      }
    }
    // Remove any return values.
    ReturnUtils::removeReturns(func, *module);
    // It's definitely worth optimizing the caller after inserting the
    // unreachable.
    return wasReturnUninhabitable;
  }